

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O2

CEAngle __thiscall
CESkyCoord::AngularSeparation
          (CESkyCoord *this,CEAngle *xcoord_first,CEAngle *ycoord_first,CEAngle *xcoord_second,
          CEAngle *ycoord_second)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  CEAngle CVar5;
  CEAngle local_40;
  double local_30;
  double local_28;
  
  dVar1 = CEAngle::operator_cast_to_double(xcoord_first);
  dVar2 = CEAngle::operator_cast_to_double(ycoord_first);
  dVar3 = CEAngle::operator_cast_to_double(xcoord_second);
  dVar4 = CEAngle::operator_cast_to_double(ycoord_second);
  local_30 = (double)iauSeps(dVar1,dVar2,dVar3,SUB84(dVar4,0));
  CEAngle::Rad(&local_40,&local_30);
  local_28 = CEAngle::operator_cast_to_double(&local_40);
  CEAngle::CEAngle((CEAngle *)this,&local_28);
  CEAngle::~CEAngle(&local_40);
  CVar5.angle_ = extraout_XMM0_Qa;
  CVar5._vptr_CEAngle = (_func_int **)this;
  return CVar5;
}

Assistant:

CEAngle CESkyCoord::AngularSeparation(const CEAngle& xcoord_first, 
                                      const CEAngle& ycoord_first,
                                      const CEAngle& xcoord_second, 
                                      const CEAngle& ycoord_second)
{
    // Call the 'iauSeps' SOFA algorithm
    return CEAngle::Rad(iauSeps(xcoord_first, ycoord_first,
                                xcoord_second, ycoord_second));
}